

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<CLI::App_*,_std::allocator<CLI::App_*>_> * __thiscall
CLI::App::get_subcommands(App *this,function<bool_(CLI::App_*)> *filter)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator __first;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> __last;
  iterator __pred;
  iterator this_00;
  long in_RSI;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_RDI;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *subcomms;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_fffffffffffffef8;
  __normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
  *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffff20;
  
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::size
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             (in_RSI + 0x2c0));
  std::allocator<CLI::App_*>::allocator((allocator<CLI::App_*> *)0x1753c4);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<CLI::App_*>::~allocator((allocator<CLI::App_*> *)0x1753e7);
  iVar2 = ::std::
          begin<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                    ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)in_stack_fffffffffffffef8);
  iVar3 = ::std::
          end<std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>
                    ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      *)in_stack_fffffffffffffef8);
  __first = ::std::begin<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                      (in_stack_fffffffffffffef8);
  __last = ::std::
           transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App*)>const&)::_lambda(std::shared_ptr<CLI::App>const&)_1_>
                     (iVar2._M_current,iVar3._M_current,__first._M_current);
  bVar1 = ::std::function::operator_cast_to_bool((function<bool_(CLI::App_*)> *)0x17548d);
  if (bVar1) {
    __pred = ::std::begin<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                       (in_stack_fffffffffffffef8);
    ::std::end<std::vector<CLI::App*,std::allocator<CLI::App*>>>(in_stack_fffffffffffffef8);
    ::std::
    remove_if<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,CLI::App::get_subcommands(std::function<bool(CLI::App*)>const&)::_lambda(CLI::App*)_1_>
              ((__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                )__first._M_current,__last,(anon_class_8_1_552cbcb6_for__M_pred)__pred._M_current);
    __gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>::
    __normal_iterator<CLI::App**>
              (in_stack_ffffffffffffff00,
               (__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                *)in_stack_fffffffffffffef8);
    this_00 = ::std::end<std::vector<CLI::App*,std::allocator<CLI::App*>>>
                        (in_stack_fffffffffffffef8);
    __gnu_cxx::__normal_iterator<CLI::App*const*,std::vector<CLI::App*,std::allocator<CLI::App*>>>::
    __normal_iterator<CLI::App**>
              ((__normal_iterator<CLI::App_*const_*,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                *)this_00._M_current,
               (__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                *)in_stack_fffffffffffffef8);
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::erase
              ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)__pred._M_current,
               (const_iterator)__first._M_current,(const_iterator)__last._M_current);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::vector<App *> App::get_subcommands(const std::function<bool(App *)> &filter) {
    std::vector<App *> subcomms(subcommands_.size());
    std::transform(
        std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) { return v.get(); });

    if(filter) {
        subcomms.erase(
            std::remove_if(std::begin(subcomms), std::end(subcomms), [&filter](App *app) { return !filter(app); }),
            std::end(subcomms));
    }

    return subcomms;
}